

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_set_zero(mbedtls_ecp_point *pt)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_lset(&pt->X,1);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_lset(&pt->Y,1);
    if (iVar1 == 0) {
      iVar1 = mbedtls_mpi_lset(&pt->Z,0);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_set_zero( mbedtls_ecp_point *pt )
{
    int ret;

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->X , 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Y , 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Z , 0 ) );

cleanup:
    return( ret );
}